

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_dense.cpp
# Opt level: O3

void __thiscall
test_vector_dense_scalar_multiplication_Test::TestBody
          (test_vector_dense_scalar_multiplication_Test *this)

{
  double lhs_value;
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  double *element;
  double *pdVar4;
  pointer *__ptr;
  char *pcVar5;
  Vector_Dense<double,_2UL> static_vector;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_70;
  pointer local_68;
  AssertHelper local_58;
  undefined8 uStack_50;
  AssertHelper local_40;
  vector<double,_std::allocator<double>_> local_38;
  vector<double,_std::allocator<double>_> local_20;
  
  local_88 = (undefined1  [8])local_78;
  local_78 = (undefined1  [8])0x3ff0000000000000;
  pbStack_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               0x4000000000000000;
  local_68 = (pointer)0x4008000000000000;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  Disa::Vector_Dense<double,_0UL>::Vector_Dense
            ((Vector_Dense<double,_0UL> *)&local_38,(initializer_list<double> *)local_88);
  std::vector<double,_std::allocator<double>_>::vector(&local_20,&local_38);
  for (pdVar4 = local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar4 != local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar4 = pdVar4 + 1) {
    *pdVar4 = *pdVar4 * -3.0;
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_78,&local_20);
  pdVar3 = local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pdVar2 = local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_78;
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)pbStack_70;
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_68;
  _local_78 = (_Type)ZEXT816(0);
  local_68 = (pointer)0x0;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2,(long)pdVar3 - (long)pdVar2);
    if (local_78 != (undefined1  [8])0x0) {
      operator_delete((void *)local_78,(long)local_68 - (long)local_78);
    }
  }
  if (local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_78,"dynamic_vector[0]","-3.0",
             *local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start,-3.0);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_88);
    if (pbStack_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)pbStack_70;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x9d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_88 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)((long)*(double *)local_88 + 8))();
    }
  }
  if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),pbStack_70);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_78,"dynamic_vector[1]","-6.0",
             local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[1],-6.0);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_88);
    if (pbStack_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)pbStack_70;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x9e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_88 != (undefined1  [8])0x0) {
      (**(code **)((long)*(double *)local_88 + 8))();
    }
  }
  if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),pbStack_70);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_78,"dynamic_vector[2]","-9.0",
             local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[2],-9.0);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_88);
    if (pbStack_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)pbStack_70;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0x9f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_88 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)((long)*(double *)local_88 + 8))();
    }
  }
  if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_78 + 8),pbStack_70);
  }
  local_88 = (undefined1  [8])&local_58;
  local_58.data_ = (AssertHelperData *)0x4008000000000000;
  uStack_50 = 0xc014000000000000;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  Disa::Vector_Dense<double,_2UL>::Vector_Dense
            ((Vector_Dense<double,_2UL> *)local_78,(initializer_list<double> *)local_88);
  lhs_value = (double)local_78 * 4.0;
  dVar1 = (double)pbStack_70 * 4.0;
  unique0x10000253 = SUB84(dVar1,0);
  local_78 = (undefined1  [8])lhs_value;
  unique0x10000257 = (int)((ulong)dVar1 >> 0x20);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"static_vector[0]","12.0",lhs_value,12.0);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0xa3,pcVar5);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_58.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_58.data_ + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_88,"static_vector[1]","-20.0",(double)pbStack_70,-20.0);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_vector_dense.cpp"
               ,0xa4,pcVar5);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_58.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_58.data_ + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  if (local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(test_vector_dense, scalar_multiplication) {
  Vector_Dense<Scalar, 0> dynamic_vector = {1.0, 2.0, 3.0};
  dynamic_vector = -3.0 * dynamic_vector;
  EXPECT_DOUBLE_EQ(dynamic_vector[0], -3.0);
  EXPECT_DOUBLE_EQ(dynamic_vector[1], -6.0);
  EXPECT_DOUBLE_EQ(dynamic_vector[2], -9.0);

  Vector_Dense<Scalar, 2> static_vector = {3.0, -5.0};
  static_vector = 4.0 * static_vector;
  EXPECT_DOUBLE_EQ(static_vector[0], 12.0);
  EXPECT_DOUBLE_EQ(static_vector[1], -20.0);
}